

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.cc
# Opt level: O3

void __thiscall
testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
Matcher(Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,string *s)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_78
  ;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  )._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001598d0;
  pcVar1 = (s->_M_dataplus)._M_p;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,pcVar1,pcVar1 + s->_M_string_length)
  ;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>((string *)local_40,local_60,local_60 + local_58);
  internal::ComparisonBase::operator_cast_to_Matcher(&local_78,(ComparisonBase *)local_40);
  _Var3._M_pi = local_78.
                super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .impl_.
                super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  peVar2 = local_78.
           super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .impl_.
           super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_78.
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_78.
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->
            super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).impl_.
            super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar2;
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var3._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_78.
    super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00159af8;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    local_78.
    super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00159af8;
    if (local_78.
        super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .impl_.
        super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.
                 super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .impl_.
                 super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return;
}

Assistant:

Matcher<std::string>::Matcher(const std::string& s) { *this = Eq(s); }